

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O1

int demoCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)

{
  tm *ptVar1;
  time_t tt;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar1 = gmtime(&tStack_18);
  if (ptVar1 != (tm *)0x0) {
    pOut->tm_hour = ptVar1->tm_hour;
    pOut->tm_min = ptVar1->tm_min;
    pOut->tm_sec = ptVar1->tm_sec;
    pOut->tm_mon = ptVar1->tm_mon;
    pOut->tm_mday = ptVar1->tm_mday;
    pOut->tm_year = ptVar1->tm_year + 0x76c;
    pOut->tm_yday = ptVar1->tm_yday;
    pOut->tm_wday = ptVar1->tm_wday;
    pOut->tm_isdst = ptVar1->tm_isdst;
    pOut->tm_zone = (char *)0x0;
    pOut->tm_gmtoff = 0;
  }
  return 0;
}

Assistant:

static int demoCurrentTime(unqlite_vfs *pVfs, Sytm *pOut){
	time_t tt;
#if defined(_MSC_VER) || defined(__MINGW32__)
    errno_t err;
    struct tm pTm;
#else
    struct tm *pTm;
#endif  /* defined(_MSC_VER) || defined(__MINGW32__) */
	time(&tt);
#if defined(_MSC_VER) || defined(__MINGW32__)
    err = gmtime_s(&pTm, &tt);
    if ( !err ) {
        STRUCT_TM_TO_SYTM(&pTm,pOut);
    }
#else
	pTm = gmtime(&tt);
	if( pTm ){ /* Yes, it can fail */
		STRUCT_TM_TO_SYTM(pTm,pOut);
	}
#endif  /* defined(_MSC_VER) || defined(__MINGW32__) */
	return UNQLITE_OK;
}